

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_two_connects.c
# Opt level: O0

void handle_connect(cio_socket *socket,void *handler_context,cio_error err)

{
  cio_error cVar1;
  cio_io_stream *stream;
  cio_buffered_stream *buffered_stream;
  client *client;
  cio_error err_local;
  void *handler_context_local;
  cio_socket *socket_local;
  
  if (err == CIO_SUCCESS) {
    cio_read_buffer_init
              ((cio_read_buffer *)((long)handler_context + 0xf0),
               (void *)((long)handler_context + 0x110),0x80);
    stream = cio_socket_get_io_stream(socket);
    cio_buffered_stream_init((cio_buffered_stream *)((long)handler_context + 0x10),stream);
    cio_write_buffer_head_init((cio_write_buffer *)((long)handler_context + 0xd0));
    cio_write_buffer_const_element_init
              ((cio_write_buffer *)((long)handler_context + 0xb0),"Hello",6);
    cio_write_buffer_queue_tail
              ((cio_write_buffer *)((long)handler_context + 0xd0),
               (cio_write_buffer *)((long)handler_context + 0xb0));
    cVar1 = cio_buffered_stream_write
                      ((cio_buffered_stream *)((long)handler_context + 0x10),
                       (cio_write_buffer *)((long)handler_context + 0xd0),client_handle_write,
                       handler_context);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"client write failed!\n");
      cio_socket_close(socket);
    }
  }
  else {
    fprintf(_stderr,"Connect failed!\n");
    cio_socket_close(socket);
  }
  return;
}

Assistant:

static void handle_connect(struct cio_socket *socket, void *handler_context, enum cio_error err)
{
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "Connect failed!\n");
		cio_socket_close(socket);
		return;
	}

	struct client *client = (struct client *)handler_context;
	cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	struct cio_buffered_stream *buffered_stream = &client->buffered_stream;
	cio_buffered_stream_init(buffered_stream, cio_socket_get_io_stream(socket));

	cio_write_buffer_head_init(&client->wbh);
	cio_write_buffer_const_element_init(&client->wb, HELLO, sizeof(HELLO));
	cio_write_buffer_queue_tail(&client->wbh, &client->wb);
	err = cio_buffered_stream_write(buffered_stream, &client->wbh, client_handle_write, client);

	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "client write failed!\n");
		cio_socket_close(socket);
		return;
	}
}